

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClassDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassDeclarationSyntax,slang::syntax::ClassDeclarationSyntax_const&>
          (BumpAllocator *this,ClassDeclarationSyntax *args)

{
  ClassDeclarationSyntax *this_00;
  
  this_00 = (ClassDeclarationSyntax *)allocate(this,0x100,8);
  slang::syntax::ClassDeclarationSyntax::ClassDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }